

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O1

bool __thiscall CheckStructure::isMain(CheckStructure *this,string *nameMain)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  pointer pbVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  __n = nameMain->_M_string_length;
  if (__n == (this->nMain)._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar3 = bcmp((nameMain->_M_dataplus)._M_p,(this->nMain)._M_dataplus._M_p,__n);
    if (iVar3 == 0) {
      return true;
    }
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)nameMain);
  pbVar2 = (this->delimiters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68._M_string_length == pbVar2[5]._M_string_length) {
    if (local_68._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_68._M_dataplus._M_p,pbVar2[5]._M_dataplus._M_p,local_68._M_string_length);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((bVar4) &&
     (std::__cxx11::string::substr((ulong)&local_48,(ulong)nameMain),
     local_40 == (this->nMain)._M_string_length)) {
    if (local_40 == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp(local_48,(this->nMain)._M_dataplus._M_p,local_40);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if ((bVar4) && (local_48 != local_38)) {
    operator_delete(local_48);
  }
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar5) {
    this->m_countCalls = this->m_countCalls + 2;
    std::__cxx11::string::substr((ulong)&local_68,(ulong)nameMain);
    pbVar2 = (this->delimiters).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_68._M_string_length == pbVar2[2]._M_string_length) {
      if (local_68._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_68._M_dataplus._M_p,pbVar2[2]._M_dataplus._M_p,local_68._M_string_length)
        ;
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    bVar4 = true;
    if (bVar5) {
      this->m_countCalls = this->m_countCalls + 1;
      std::__cxx11::string::substr((ulong)&local_68,(ulong)nameMain);
      if (local_68._M_string_length == (this->nReturn)._M_string_length) {
        if (local_68._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar3 = bcmp(local_68._M_dataplus._M_p,(this->nReturn)._M_dataplus._M_p,
                       local_68._M_string_length);
          bVar5 = iVar3 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if (bVar5) {
        this->m_countCalls = this->m_countCalls + 1;
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)nameMain);
    pbVar2 = (this->delimiters).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_68._M_string_length == pbVar2->_M_string_length) {
      if (local_68._M_string_length == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_68._M_dataplus._M_p,(pbVar2->_M_dataplus)._M_p,local_68._M_string_length)
        ;
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (bVar4) {
      this->m_countCalls = this->m_countCalls + 1;
      bVar4 = true;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"wrong name of main func","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errors,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool CheckStructure::isMain(string nameMain) {
    if (nameMain == nMain)
        return true;
    if ((nameMain.substr(4, 2) == delimiters[5]) && (nameMain.substr(0, 4) == nMain)) {
        m_countCalls += 2;
        if (nameMain.substr(6, 1) == delimiters[2]) {
            m_countCalls++;
            if (nameMain.substr(7, 6) == nReturn)
                m_countCalls++;
        }
        return true;
    }
    if (nameMain.substr(4, 1) == delimiters[0]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong name of main func");
    return false;
}